

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

void __thiscall
pbrt::Sphere::Sphere
          (Sphere *this,Transform *renderFromObject,Transform *objectFromRender,
          bool reverseOrientation,Float radius,Float zMin,Float zMax,Float phiMax)

{
  bool bVar1;
  float *pfVar2;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  Float FVar4;
  double dVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  float in_XMM3_Da;
  Transform *in_stack_00000110;
  float local_28;
  float local_24;
  float local_20;
  byte local_19;
  undefined8 local_18;
  undefined8 local_10;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_19 = in_CL & 1;
  *in_RDI = in_XMM0_Da;
  local_20 = in_XMM0_Da;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pfVar2 = std::min<float>(&local_24,&local_28);
  fVar3 = Clamp<float,float,float>(*pfVar2,-local_20,local_20);
  in_RDI[1] = fVar3;
  pfVar2 = std::max<float>(&local_24,&local_28);
  fVar3 = Clamp<float,float,float>(*pfVar2,-local_20,local_20);
  in_RDI[2] = fVar3;
  pfVar2 = std::min<float>(&local_24,&local_28);
  auVar6._0_4_ = Clamp<float,int,int>(*pfVar2 / local_20,-1,1);
  auVar6._4_60_ = extraout_var;
  dVar5 = std::acos(auVar6._0_8_);
  in_RDI[3] = SUB84(dVar5,0);
  pfVar2 = std::max<float>(&local_24,&local_28);
  auVar7._0_4_ = Clamp<float,int,int>(*pfVar2 / local_20,-1,1);
  auVar7._4_60_ = extraout_var_00;
  dVar5 = std::acos(auVar7._0_8_);
  in_RDI[4] = SUB84(dVar5,0);
  fVar3 = Clamp<float,int,int>(in_XMM3_Da,0,0x168);
  FVar4 = Radians(fVar3);
  in_RDI[5] = FVar4;
  *(undefined8 *)(in_RDI + 6) = local_10;
  *(undefined8 *)(in_RDI + 8) = local_18;
  *(byte *)(in_RDI + 10) = local_19 & 1;
  bVar1 = Transform::SwapsHandedness(in_stack_00000110);
  *(bool *)((long)in_RDI + 0x29) = bVar1;
  return;
}

Assistant:

Sphere(const Transform *renderFromObject, const Transform *objectFromRender,
           bool reverseOrientation, Float radius, Float zMin, Float zMax, Float phiMax)
        : renderFromObject(renderFromObject),
          objectFromRender(objectFromRender),
          reverseOrientation(reverseOrientation),
          transformSwapsHandedness(renderFromObject->SwapsHandedness()),
          radius(radius),
          zMin(Clamp(std::min(zMin, zMax), -radius, radius)),
          zMax(Clamp(std::max(zMin, zMax), -radius, radius)),
          thetaZMin(std::acos(Clamp(std::min(zMin, zMax) / radius, -1, 1))),
          thetaZMax(std::acos(Clamp(std::max(zMin, zMax) / radius, -1, 1))),
          phiMax(Radians(Clamp(phiMax, 0, 360))) {}